

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O3

int __thiscall branch_and_reduce_algorithm::max_nh_vtx(branch_and_reduce_algorithm *this)

{
  pointer pvVar1;
  pointer piVar2;
  pointer piVar3;
  pointer piVar4;
  int *piVar5;
  pointer piVar6;
  int *piVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  int *piVar14;
  iterator __begin3;
  int *piVar15;
  
  iVar11 = this->n;
  if (iVar11 < 1) {
    iVar9 = -1;
  }
  else {
    pvVar1 = (this->adj).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar2 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
    piVar3 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    piVar4 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar12 = 0;
    uVar8 = 0xffffffff;
    iVar13 = 0;
    do {
      if (piVar2[uVar12] < 0) {
        iVar9 = (this->used).uid;
        iVar11 = iVar9 + 1;
        (this->used).uid = iVar11;
        if (iVar9 < -1) {
          if (piVar3 != piVar4) {
            uVar10 = 0;
            do {
              piVar4[uVar10] = 0;
              uVar10 = uVar10 + 1;
            } while ((uVar10 & 0xffffffff) < (ulong)((long)piVar3 - (long)piVar4 >> 2));
          }
          (this->used).uid = 1;
          iVar11 = 1;
        }
        piVar15 = pvVar1[uVar12].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar5 = *(pointer *)
                  ((long)&pvVar1[uVar12].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data + 8);
        iVar9 = 0;
        if (piVar15 != piVar5) {
          piVar6 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar14 = piVar15;
          do {
            if (piVar2[*piVar14] < 0) {
              piVar6[*piVar14] = iVar11;
            }
            piVar14 = piVar14 + 1;
          } while (piVar14 != piVar5);
          iVar9 = 0;
          if (piVar15 != piVar5) {
            piVar6 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar9 = 0;
            do {
              piVar7 = *(pointer *)
                        ((long)&pvVar1[*piVar15].super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data + 8);
              for (piVar14 = pvVar1[*piVar15].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start; piVar14 != piVar7;
                  piVar14 = piVar14 + 1) {
                iVar11 = (this->used).uid;
                if (piVar6[*piVar14] != iVar11) {
                  iVar9 = iVar9 + 1;
                  piVar6[*piVar14] = iVar11;
                }
              }
              piVar15 = piVar15 + 1;
            } while (piVar15 != piVar5);
          }
        }
        if (iVar13 < iVar9) {
          uVar8 = uVar12 & 0xffffffff;
          iVar13 = iVar9;
        }
        iVar11 = this->n;
      }
      iVar9 = (int)uVar8;
      uVar12 = uVar12 + 1;
    } while ((long)uVar12 < (long)iVar11);
  }
  return iVar9;
}

Assistant:

int branch_and_reduce_algorithm::max_nh_vtx()
{
    int v = -1;
    int maxN2 = 0;

    for (int i = 0; i < n; i++)
    {
        if (x[i] < 0)
        {
            used.clear();
            for (int u : adj[i])
            {
                if (x[u] < 0)
                    used.add(u);
            }

            int cnt = 0;
            for (int u : adj[i])
            {
                for (int v : adj[u])
                {
                    if (!used.get(v))
                    {
                        cnt++;
                        used.add(v);
                    }
                }
            }

            if (cnt > maxN2)
            {
                v = i;
                maxN2 = cnt;
            }
        }
    }

    return v;
}